

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddSymm.c
# Opt level: O2

Extra_SymmInfo_t * Extra_SymmPairsComputeNaive(DdManager *dd,DdNode *bFunc)

{
  DdNode *pDVar1;
  char **ppcVar2;
  uint nVars;
  int iVar3;
  DdNode *n;
  Extra_SymmInfo_t *pEVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  DdNode *pDVar8;
  long lVar9;
  
  n = Cudd_Support(dd,bFunc);
  Cudd_Ref(n);
  nVars = Extra_bddSuppSize(dd,n);
  pEVar4 = Extra_SymmPairsAllocate(nVars);
  pEVar4->nVarsMax = dd->size;
  pDVar1 = dd->one;
  lVar6 = 0;
  for (pDVar8 = n; pDVar8 != pDVar1; pDVar8 = (pDVar8->type).kids.T) {
    *(DdHalfWord *)((long)pEVar4->pVars + lVar6) = pDVar8->index;
    lVar6 = lVar6 + 4;
  }
  uVar7 = 0;
  uVar5 = 0;
  if (0 < (int)nVars) {
    uVar5 = (ulong)nVars;
  }
  lVar6 = 1;
  for (; lVar9 = lVar6, uVar7 != uVar5; uVar7 = uVar7 + 1) {
    for (; (int)lVar9 < (int)nVars; lVar9 = lVar9 + 1) {
      iVar3 = Extra_bddCheckVarsSymmetricNaive(dd,bFunc,pEVar4->pVars[uVar7],pEVar4->pVars[lVar9]);
      ppcVar2 = pEVar4->pSymms;
      ppcVar2[uVar7][lVar9] = (char)iVar3;
      ppcVar2[lVar9][uVar7] = (char)iVar3;
      if (ppcVar2[uVar7][lVar9] != '\0') {
        pEVar4->nSymms = pEVar4->nSymms + 1;
      }
    }
    lVar6 = lVar6 + 1;
  }
  Cudd_RecursiveDeref(dd,n);
  return pEVar4;
}

Assistant:

Extra_SymmInfo_t * Extra_SymmPairsComputeNaive( DdManager * dd, DdNode * bFunc )
{
    DdNode * bSupp, * bTemp;
    int nSuppSize;
    Extra_SymmInfo_t * p;
    int i, k;

    // compute the support
    bSupp = Cudd_Support( dd, bFunc );   Cudd_Ref( bSupp );
    nSuppSize = Extra_bddSuppSize( dd, bSupp );
//printf( "Support = %d. ", nSuppSize );
//Extra_bddPrint( dd, bSupp );
//printf( "%d ", nSuppSize );

    // allocate the storage for symmetry info
    p = Extra_SymmPairsAllocate( nSuppSize );

    // assign the variables
    p->nVarsMax = dd->size;
    for ( i = 0, bTemp = bSupp; bTemp != b1; bTemp = cuddT(bTemp), i++ )
        p->pVars[i] = bTemp->index;

    // go through the candidate pairs and check using Idea1
    for ( i = 0; i < nSuppSize; i++ )
    for ( k = i+1; k < nSuppSize; k++ )
    {
        p->pSymms[k][i] = p->pSymms[i][k] = Extra_bddCheckVarsSymmetricNaive( dd, bFunc, p->pVars[i], p->pVars[k] );
        if ( p->pSymms[i][k] )
             p->nSymms++;
    }

    Cudd_RecursiveDeref( dd, bSupp );
    return p;

}